

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*>::
emplace_back<slang::syntax::DelayedSequenceElementSyntax*>
          (SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*> *this,
          DelayedSequenceElementSyntax **args)

{
  long lVar1;
  reference ppDVar2;
  pointer ppDVar3;
  
  lVar1 = *(long *)(this + 8);
  ppDVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppDVar3 = emplaceRealloc<slang::syntax::DelayedSequenceElementSyntax*>(this,ppDVar3,args);
    return ppDVar3;
  }
  *ppDVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppDVar2 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::back
                      ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
  return ppDVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }